

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O2

void quicly_sendstate_reset(quicly_sendstate_t *state)

{
  int iVar1;
  uint64_t uVar2;
  
  uVar2 = state->final_size;
  if (uVar2 == 0xffffffffffffffff) {
    uVar2 = state->size_inflight;
    state->final_size = uVar2;
  }
  iVar1 = quicly_ranges_add(&state->acked,0,uVar2 + 1);
  if (iVar1 == 0) {
    quicly_ranges_clear(&state->pending);
    return;
  }
  __assert_fail("ret == 0 && \"guaranteed to succeed, because the numebr of ranges never increases\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                ,0x5d,"void quicly_sendstate_reset(quicly_sendstate_t *)");
}

Assistant:

void quicly_sendstate_reset(quicly_sendstate_t *state)
{
    int ret;

    if (state->final_size == UINT64_MAX)
        state->final_size = state->size_inflight;

    ret = quicly_ranges_add(&state->acked, 0, state->final_size + 1);
    assert(ret == 0 && "guaranteed to succeed, because the numebr of ranges never increases");
    quicly_ranges_clear(&state->pending);
}